

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  uint uVar1;
  U32 UVar2;
  ulong in_RDX;
  optState_t *in_RDI;
  uint baseOFCfreqs [32];
  uint ml_1;
  uint baseLLfreqs [36];
  uint lit_1;
  U32 bitCost_3;
  U32 scaleLog_3;
  FSE_CState_t ofstate;
  uint of;
  U32 bitCost_2;
  U32 scaleLog_2;
  FSE_CState_t mlstate;
  uint ml;
  U32 bitCost_1;
  U32 scaleLog_1;
  FSE_CState_t llstate;
  uint ll;
  U32 bitCost;
  U32 scaleLog;
  uint lit;
  int compressedLiterals;
  uint local_1f8;
  U32 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  base_directive_e in_stack_fffffffffffffe14;
  U32 in_stack_fffffffffffffe18;
  U32 in_stack_fffffffffffffe1c;
  U32 in_stack_fffffffffffffe20;
  U32 in_stack_fffffffffffffe24;
  uint *in_stack_fffffffffffffe28;
  FSE_CState_t *in_stack_fffffffffffffe30;
  uint *in_stack_fffffffffffffe38;
  uint local_15c;
  uint local_158 [39];
  undefined4 local_bc;
  U32 local_b8;
  undefined4 local_b4;
  void *local_a0;
  uint local_8c;
  U32 local_88;
  undefined4 local_84;
  void *local_70;
  uint local_5c;
  U32 local_58;
  undefined4 local_54;
  void *local_40;
  uint local_30;
  U32 local_2c;
  undefined4 local_28;
  uint local_24;
  int local_20;
  ulong local_18;
  optState_t *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = ZSTD_compressedLiterals(in_RDI);
  local_8->priceType = zop_dynamic;
  if (local_8->litLengthSum == 0) {
    if (local_18 < 9) {
      local_8->priceType = zop_predef;
    }
    if (local_8->symbolCosts == (ZSTD_entropyCTables_t *)0x0) {
      __assert_fail("optPtr->symbolCosts != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7fbe,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if ((local_8->symbolCosts->huf).repeatMode == HUF_repeat_valid) {
      local_8->priceType = zop_dynamic;
      if (local_20 != 0) {
        if (local_8->litFreq == (uint *)0x0) {
          __assert_fail("optPtr->litFreq != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fc7,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        local_8->litSum = 0;
        for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
          local_28 = 0xb;
          local_2c = HUF_getNbBitsFromCTable
                               ((HUF_CElt *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                in_stack_fffffffffffffe0c);
          if (0xb < local_2c) {
            __assert_fail("bitCost <= scaleLog",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x7fcc,
                          "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                         );
          }
          if (local_2c == 0) {
            in_stack_fffffffffffffe14 = base_1guaranteed;
          }
          else {
            in_stack_fffffffffffffe14 = 1 << (0xbU - (char)local_2c & 0x1f);
          }
          local_8->litFreq[local_24] = in_stack_fffffffffffffe14;
          local_8->litSum = local_8->litFreq[local_24] + local_8->litSum;
        }
      }
      FSE_initCState(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_8->litLengthSum = 0;
      for (local_30 = 0; local_30 < 0x24; local_30 = local_30 + 1) {
        local_54 = 10;
        local_58 = FSE_getMaxNbBits(local_40,local_30);
        if (9 < local_58) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fd8,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        if (local_58 == 0) {
          uVar1 = 1;
        }
        else {
          uVar1 = 1 << (10U - (char)local_58 & 0x1f);
        }
        local_8->litLengthFreq[local_30] = uVar1;
        local_8->litLengthSum = local_8->litLengthFreq[local_30] + local_8->litLengthSum;
      }
      FSE_initCState(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_8->matchLengthSum = 0;
      for (local_5c = 0; local_5c < 0x35; local_5c = local_5c + 1) {
        local_84 = 10;
        local_88 = FSE_getMaxNbBits(local_70,local_5c);
        if (9 < local_88) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7fe4,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        if (local_88 == 0) {
          uVar1 = 1;
        }
        else {
          uVar1 = 1 << (10U - (char)local_88 & 0x1f);
        }
        local_8->matchLengthFreq[local_5c] = uVar1;
        local_8->matchLengthSum = local_8->matchLengthFreq[local_5c] + local_8->matchLengthSum;
      }
      FSE_initCState(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_8->offCodeSum = 0;
      for (local_8c = 0; local_8c < 0x20; local_8c = local_8c + 1) {
        local_b4 = 10;
        local_b8 = FSE_getMaxNbBits(local_a0,local_8c);
        if (9 < local_b8) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x7ff0,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        if (local_b8 == 0) {
          local_1f8 = 1;
        }
        else {
          local_1f8 = 1 << (10U - (char)local_b8 & 0x1f);
        }
        local_8->offCodeFreq[local_8c] = local_1f8;
        local_8->offCodeSum = local_8->offCodeFreq[local_8c] + local_8->offCodeSum;
      }
    }
    else {
      if (local_8->litFreq == (uint *)0x0) {
        __assert_fail("optPtr->litFreq != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x7ff7,
                      "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                     );
      }
      if (local_20 != 0) {
        local_bc = 0xff;
        HIST_count_simple(in_stack_fffffffffffffe38,(uint *)in_stack_fffffffffffffe30,
                          in_stack_fffffffffffffe28,
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        UVar2 = ZSTD_downscaleStats((uint *)CONCAT44(in_stack_fffffffffffffe24,
                                                     in_stack_fffffffffffffe20),
                                    in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,
                                    in_stack_fffffffffffffe14);
        local_8->litSum = UVar2;
      }
      memcpy(local_158,&DAT_004a4ea0,0x90);
      memcpy(local_8->litLengthFreq,local_158,0x90);
      UVar2 = sum_u32(local_158,0x24);
      local_8->litLengthSum = UVar2;
      for (local_15c = 0; local_15c < 0x35; local_15c = local_15c + 1) {
        local_8->matchLengthFreq[local_15c] = 1;
      }
      local_8->matchLengthSum = 0x35;
      memcpy(&stack0xfffffffffffffe18,&DAT_004a4f30,0x80);
      memcpy(local_8->offCodeFreq,&stack0xfffffffffffffe18,0x80);
      UVar2 = sum_u32((uint *)&stack0xfffffffffffffe18,0x20);
      local_8->offCodeSum = UVar2;
    }
  }
  else {
    if (local_20 != 0) {
      UVar2 = ZSTD_scaleStats(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                              in_stack_fffffffffffffe20);
      local_8->litSum = UVar2;
    }
    UVar2 = ZSTD_scaleStats(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                            in_stack_fffffffffffffe20);
    local_8->litLengthSum = UVar2;
    UVar2 = ZSTD_scaleStats(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                            in_stack_fffffffffffffe20);
    local_8->matchLengthSum = UVar2;
    UVar2 = ZSTD_scaleStats(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                            in_stack_fffffffffffffe20);
    local_8->offCodeSum = UVar2;
  }
  ZSTD_setBasePrices((optState_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     in_stack_fffffffffffffe1c);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* no literals stats collected -> first block assumed -> init */

        /* heuristic: use pre-defined stats for too small inputs */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {
            DEBUGLOG(5, "srcSize <= %i : use predefined stats", ZSTD_PREDEF_THRESHOLD);
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {

            /* huffman stats covering the full value set : table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                /* generate literals statistics from huffman table */
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBitsFromCTable(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* first block, no dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                /* base initial cost of literals on direct frequency within src */
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStats(optPtr->litFreq, MaxLit, 8, base_0possible);
            }

            {   unsigned const baseLLfreqs[MaxLL+1] = {
                    4, 2, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->litLengthFreq, baseLLfreqs, sizeof(baseLLfreqs));
                optPtr->litLengthSum = sum_u32(baseLLfreqs, MaxLL+1);
            }

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned const baseOFCfreqs[MaxOff+1] = {
                    6, 2, 1, 1, 2, 3, 4, 4,
                    4, 3, 2, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->offCodeFreq, baseOFCfreqs, sizeof(baseOFCfreqs));
                optPtr->offCodeSum = sum_u32(baseOFCfreqs, MaxOff+1);
            }

        }

    } else {   /* new block : scale down accumulated statistics */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_scaleStats(optPtr->litFreq, MaxLit, 12);
        optPtr->litLengthSum = ZSTD_scaleStats(optPtr->litLengthFreq, MaxLL, 11);
        optPtr->matchLengthSum = ZSTD_scaleStats(optPtr->matchLengthFreq, MaxML, 11);
        optPtr->offCodeSum = ZSTD_scaleStats(optPtr->offCodeFreq, MaxOff, 11);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}